

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::StoD(Forth *this)

{
  uint uVar1;
  SCell top;
  Forth *this_local;
  
  requireDStackDepth(this,1,"S>D");
  requireDStackAvailable(this,1,"S>D");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  if ((int)uVar1 < 0) {
    ForthStack<unsigned_int>::push(&this->dStack,0xffffffff);
  }
  else {
    ForthStack<unsigned_int>::push(&this->dStack,0);
  }
  return;
}

Assistant:

void StoD(){
			REQUIRE_DSTACK_DEPTH(1, "S>D");
			REQUIRE_DSTACK_AVAILABLE(1, "S>D");
			SCell top = dStack.getTop();
			if (top < 0)
				dStack.push(-1);
			else
				dStack.push(0);
		}